

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

void __thiscall
gl4cts::IndirectDispatchBufferStorageTestCase::IndirectDispatchBufferStorageTestCase
          (IndirectDispatchBufferStorageTestCase *this,Functions *gl,TestContext *testContext,
          GLint page_size)

{
  (this->super_BufferStorageTestCase)._vptr_BufferStorageTestCase =
       (_func_int **)&PTR__BufferStorageTestCase_020e1c30;
  this->m_dispatch_draw_call_args_start_offset = 0xffffffff;
  this->m_expected_ac_value = 0;
  this->m_gl = gl;
  this->m_global_wg_size_x = 0x800;
  this->m_helper_bo = 0;
  this->m_local_wg_size_x = 0x3ff;
  this->m_page_size = page_size;
  this->m_po = 0;
  this->m_sparse_bo = 0;
  this->m_sparse_bo_size = 0;
  this->m_sparse_bo_size_rounded = 0;
  this->m_testCtx = testContext;
  return;
}

Assistant:

IndirectDispatchBufferStorageTestCase::IndirectDispatchBufferStorageTestCase(const glw::Functions& gl,
																			 tcu::TestContext&	 testContext,
																			 glw::GLint			   page_size)
	: m_dispatch_draw_call_args_start_offset(-1)
	, m_expected_ac_value(0)
	, m_gl(gl)
	, m_global_wg_size_x(2048)
	, m_helper_bo(0)
	, m_local_wg_size_x(1023) /* must stay in sync with the local work-groups's size hardcoded in m_po's body! */
	, m_page_size(page_size)
	, m_po(0)
	, m_sparse_bo(0)
	, m_sparse_bo_size(0)
	, m_sparse_bo_size_rounded(0)
	, m_testCtx(testContext)
{
	/* Left blank intentionally */
}